

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall ArrayType::ArrayType(ArrayType *this,ArrayType *other)

{
  undefined8 uVar1;
  long in_RSI;
  Type *in_RDI;
  
  Type::Type(in_RDI,TK_ArrayType);
  in_RDI->_vptr_Type = (_func_int **)&PTR__ArrayType_00300848;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  in_RDI[1].kind = *(TypeKind *)(in_RSI + 0x18);
  in_RDI[1]._vptr_Type = *(_func_int ***)(in_RSI + 0x10);
  in_RDI[1].isConst = (bool)(*(byte *)(in_RSI + 0x1c) & 1);
  std::__cxx11::string::operator=((string *)(in_RDI + 2),(string *)(in_RSI + 0x20));
  *(byte *)&in_RDI[4]._vptr_Type = *(byte *)(in_RSI + 0x40) & 1;
  uVar1 = *(undefined8 *)(in_RSI + 0x48);
  in_RDI[4].kind = (int)uVar1;
  in_RDI[4].isConst = (bool)(char)((ulong)uVar1 >> 0x20);
  *(int3 *)&in_RDI[4].field_0xd = (int3)((ulong)uVar1 >> 0x28);
  return;
}

Assistant:

ArrayType::ArrayType(const ArrayType& other): Type(TK_ArrayType) {
    size = other.size;
    type = other.type;
    isStructArray = other.isStructArray;
    structName = other.structName;
    isPointerArray = other.isPointerArray;
    pointer = other.pointer;
}